

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_pliant(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_ADAPT pRVar2;
  uint uVar3;
  long lVar4;
  REF_INT nnode;
  REF_DBL total_force [3];
  REF_INT node_list [100];
  int local_1f4;
  REF_GRID local_1f0;
  REF_DBL local_1e8 [4];
  REF_INT local_1c8 [102];
  
  ref_node = ref_grid->node;
  uVar3 = ref_cell_node_list_around(ref_grid->cell[3],node,100,&local_1f4,local_1c8);
  if (uVar3 == 0) {
    pRVar1 = ref_node->real;
    lVar4 = 0;
    do {
      ideal_location[lVar4] = pRVar1[node * 0xf + lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_1e8[0] = 0.0;
    local_1e8[1] = 0.0;
    local_1e8[2] = 0.0;
    local_1f0 = ref_grid;
    if (0 < local_1f4) {
      lVar4 = 0;
      do {
        uVar3 = ref_smooth_add_pliant_force(ref_node,node,local_1c8[lVar4],local_1e8);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x3c8,"ref_smooth_tri_pliant",(ulong)uVar3,"edge");
          return uVar3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_1f4);
    }
    pRVar2 = local_1f0->adapt;
    uVar3 = 0;
    lVar4 = 0;
    do {
      ideal_location[lVar4] = pRVar2->smooth_pliant_alpha * local_1e8[lVar4] + ideal_location[lVar4]
      ;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x3bf,
           "ref_smooth_tri_pliant",(ulong)uVar3,"node list for edges");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_pliant(REF_GRID ref_grid, REF_INT node,
                                                REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ixyz;
  REF_INT max_node = 100, nnode;
  REF_INT node_list[100];
  REF_INT edge;
  REF_DBL total_force[3];

  RSS(ref_cell_node_list_around(ref_grid_tri(ref_grid), node, max_node, &nnode,
                                node_list),
      "node list for edges");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = ref_node_xyz(ref_node, ixyz, node);

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  for (edge = 0; edge < nnode; edge++) {
    RSS(ref_smooth_add_pliant_force(ref_node, node, node_list[edge],
                                    total_force),
        "edge");
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] +=
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  return REF_SUCCESS;
}